

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void dispatch_interrupt(Emulator *e)

{
  Ticks *pTVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  CpuState CVar6;
  byte bVar7;
  ushort uVar8;
  bool bVar9;
  
  CVar6 = (e->state).interrupt.state;
  if (((e->state).interrupt.ime == FALSE) && (CVar6 < CPU_STATE_HALT)) {
    return;
  }
  (e->state).interrupt.ime = FALSE;
  (e->state).interrupt.state = CPU_STATE_NORMAL;
  uVar3 = (e->state).reg.SP;
  (e->state).reg.SP = uVar3 - 1;
  write_u8_tick(e,uVar3 - 1,*(u8 *)((long)&(e->state).reg.PC + 1));
  bVar2 = (e->state).interrupt.new_if;
  bVar7 = (e->state).interrupt.ie & bVar2;
  if ((bVar7 & 1) == 0) {
    if ((bVar7 & 2) == 0) {
      if ((bVar7 & 4) != 0) {
        (e->state).interrupt.new_if = bVar2 & 0xfb;
        uVar5 = (e->state).reg.SP;
        (e->state).reg.SP = uVar5 - 1;
        write_u8_tick(e,uVar5 - 1,(u8)(e->state).reg.PC);
        (e->state).reg.PC = 0x50;
        if (CPU_STATE_HALT_BUG < CVar6) {
          (e->state).interrupt.if_ = (e->state).interrupt.new_if;
          pTVar1 = &(e->state).ticks;
          *pTVar1 = *pTVar1 + (e->state).cpu_tick;
        }
        goto LAB_0010c089;
      }
      if ((bVar7 & 8) == 0) {
        bVar9 = (bVar7 & 0x10) == 0;
        uVar8 = 0x60;
        if (bVar9) {
          uVar8 = bVar7 & 0x10;
        }
        bVar7 = -bVar9 | 0xef;
      }
      else {
        uVar8 = 0x58;
        bVar7 = 0xf7;
      }
    }
    else {
      uVar8 = 0x48;
      bVar7 = 0xfd;
    }
  }
  else {
    uVar8 = 0x40;
    bVar7 = 0xfe;
  }
  (e->state).interrupt.new_if = bVar7 & bVar2;
  uVar4 = (e->state).reg.SP;
  (e->state).reg.SP = uVar4 - 1;
  write_u8_tick(e,uVar4 - 1,(u8)(e->state).reg.PC);
  (e->state).reg.PC = uVar8;
LAB_0010c089:
  (e->state).interrupt.if_ = (e->state).interrupt.new_if;
  (e->state).ticks = (e->state).ticks + (e->state).cpu_tick * 2;
  return;
}

Assistant:

static void dispatch_interrupt(Emulator* e) {
  Bool was_halt = INTR.state >= CPU_STATE_HALT;
  if (!(INTR.ime || was_halt)) {
    return;
  }

  INTR.ime = FALSE;
  INTR.state = CPU_STATE_NORMAL;

  /* Write MSB of PC. */
  RSP--; WRITE8(RSP, REG.PC >> 8);

  /* Now check which interrupt to raise, after having written the MSB of PC.
   * This behavior is needed to pass the ie_push mooneye-gb test. */
  u8 interrupt = INTR.new_if & INTR.ie;

  Bool delay = FALSE;
  u8 mask = 0;
  Address vector = 0;
  if (interrupt & IF_VBLANK) {
    HOOK(vblank_interrupt_i, PPU.frame);
    vector = 0x40;
    mask = IF_VBLANK;
  } else if (interrupt & IF_STAT) {
    HOOK(stat_interrupt_cccc, STAT.y_compare.irq ? 'Y' : '.',
         STAT.mode2.irq ? 'O' : '.', STAT.vblank.irq ? 'V' : '.',
         STAT.hblank.irq ? 'H' : '.');
    vector = 0x48;
    mask = IF_STAT;
  } else if (interrupt & IF_TIMER) {
    HOOK0(timer_interrupt_v);
    vector = 0x50;
    mask = IF_TIMER;
    delay = was_halt;
  } else if (interrupt & IF_SERIAL) {
    HOOK0(serial_interrupt_v);
    vector = 0x58;
    mask = IF_SERIAL;
  } else if (interrupt & IF_JOYPAD) {
    HOOK0(joypad_interrupt_v);
    vector = 0x60;
    mask = IF_JOYPAD;
  } else {
    /* Interrupt was canceled. */
    vector = 0;
    mask = 0;
  }

  INTR.new_if &= ~mask;

  /* Now write the LSB of PC. */
  RSP--; WRITE8(RSP, REG.PC);
  REG.PC = vector;

  if (delay) {
    tick(e);
  }
  tick(e);
  tick(e);
}